

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O1

void __thiscall argparse::ArgumentParser::ArgumentParser(ArgumentParser *this,string *aProgramName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Rb_tree_header *p_Var3;
  pointer pcVar4;
  undefined8 uVar5;
  Argument *pAVar6;
  long *local_50 [2];
  long local_40 [2];
  
  paVar1 = &(this->mProgramName).field_2;
  (this->mProgramName)._M_dataplus._M_p = (pointer)paVar1;
  pcVar4 = (aProgramName->_M_dataplus)._M_p;
  paVar2 = &aProgramName->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar5 = *(undefined8 *)((long)&aProgramName->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->mProgramName).field_2 + 8) = uVar5;
  }
  else {
    (this->mProgramName)._M_dataplus._M_p = pcVar4;
    (this->mProgramName).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->mProgramName)._M_string_length = aProgramName->_M_string_length;
  (aProgramName->_M_dataplus)._M_p = (pointer)paVar2;
  aProgramName->_M_string_length = 0;
  (aProgramName->field_2)._M_local_buf[0] = '\0';
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mPositionalArguments;
  (this->mPositionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->mOptionalArguments;
  (this->mOptionalArguments).
  super__List_base<argparse::Argument,_std::allocator<argparse::Argument>_>._M_impl._M_node._M_size
       = 0;
  p_Var3 = &(this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
  (this->mArgumentMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pAVar6 = add_argument<char_const*,char_const*>(this,"-h","--help");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"show this help message and exit","");
  std::__cxx11::string::operator=((string *)&pAVar6->mHelp,(string *)local_50);
  pAVar6->mNumArgs = 0;
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  return;
}

Assistant:

explicit ArgumentParser(std::string aProgramName = {})
      : mProgramName(std::move(aProgramName)) {
    add_argument("-h", "--help")
        .help("show this help message and exit")
        .nargs(0);
  }